

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

iterator * __thiscall
density::
heter_queue<density::runtime_type<density::feature_list<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density_tests::feature_call_update>_>,_density::basic_default_allocator<65536UL>_>
::begin(iterator *__return_storage_ptr__,
       heter_queue<density::runtime_type<density::feature_list<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density_tests::feature_call_update>_>,_density::basic_default_allocator<65536UL>_>
       *this)

{
  ControlBlock *i_control;
  
  i_control = first_valid(this,this->m_head);
  iterator::iterator(__return_storage_ptr__,this,i_control);
  return __return_storage_ptr__;
}

Assistant:

iterator begin() noexcept { return iterator(this, first_valid(m_head)); }